

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96Verify(bign_params *params,octet *oid_der,size_t oid_len,octet *hash,octet *sig,
                  octet *pubkey)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec_00;
  void *in_RCX;
  long in_RDX;
  long *in_RDI;
  void *in_R8;
  octet *in_R9;
  octet *stack;
  word *s1;
  word *s0;
  word *H;
  word *R;
  word *Q;
  ec_o *ec;
  void *state;
  size_t n;
  err_t code;
  void *in_stack_ffffffffffffff58;
  u64 *in_stack_ffffffffffffff60;
  word *state_00;
  size_t in_stack_ffffffffffffff68;
  word *a;
  octet *in_stack_ffffffffffffff70;
  octet *hash_00;
  char *in_stack_ffffffffffffff78;
  word *mod;
  word *a_00;
  bign_params *in_stack_ffffffffffffff90;
  word *a_01;
  void *in_stack_ffffffffffffff98;
  word *b;
  bign96_deep_i in_stack_ffffffffffffffa0;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else if (*in_RDI == 0x60) {
    if ((in_RDX != -1) &&
       (sVar4 = oidFromDER(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68), sVar4 != 0xffffffffffffffff)) {
      bign96Start_keep(in_stack_ffffffffffffffa0);
      ec_00 = (ec_o *)blobCreate((size_t)in_stack_ffffffffffffff58);
      if (ec_00 == (ec_o *)0x0) {
        return 0x6e;
      }
      eVar2 = bign96Start(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      if (eVar2 != 0) {
        blobClose((blob_t)0x14b118);
        return eVar2;
      }
      sVar4 = ec_00->f->n;
      bVar1 = memIsValid(in_RCX,0x18);
      if (((bVar1 == 0) || (bVar1 = memIsValid(in_R8,0x22), bVar1 == 0)) ||
         (bVar1 = memIsValid(in_R9,0x30), bVar1 == 0)) {
        blobClose((blob_t)0x14b18d);
        return 0x6d;
      }
      b = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
      a = b + sVar4 * 2;
      a_00 = a + sVar4;
      mod = a_00 + sVar4;
      a_01 = a;
      state_00 = b;
      bVar1 = (*ec_00->f->from)(b,in_R9,ec_00->f,mod);
      if ((bVar1 == 0) ||
         (bVar1 = (*ec_00->f->from)(state_00 + sVar4,in_R9 + 0x18,ec_00->f,mod), bVar1 == 0)) {
        blobClose((blob_t)0x14b270);
        return 0x1f9;
      }
      u64From(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14b298);
      iVar3 = wwCmp(a_00,ec_00->order,sVar4);
      if (-1 < iVar3) {
        blobClose((blob_t)0x14b2bf);
        return 0x1fe;
      }
      u64From(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14b2e6);
      iVar3 = wwCmp(a_01,ec_00->order,sVar4);
      if (-1 < iVar3) {
        zzSub2(a_01,ec_00->order,sVar4);
      }
      zzAddMod(a_01,a,a_00,mod,(size_t)in_stack_ffffffffffffff70);
      memCopy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14b351);
      *(undefined1 *)((long)a + 0xb) = 0;
      *(undefined1 *)((long)a + 10) = 0;
      *(undefined1 *)((long)a + 0xc) = 0x80;
      u64From(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14b380);
      hash_00 = (octet *)0x2;
      bVar1 = ecAddMulA(b,ec_00,mod,2,ec_00->base,a_00,sVar4);
      if (bVar1 == 0) {
        blobClose((blob_t)0x14b3de);
        return 0x1fe;
      }
      (*ec_00->f->to)((octet *)b,b,ec_00->f,mod);
      beltHashStart(state_00);
      beltHashStepH(hash_00,(size_t)a,state_00);
      beltHashStepH(hash_00,(size_t)a,state_00);
      beltHashStepH(hash_00,(size_t)a,state_00);
      bVar1 = beltHashStepV2(hash_00,(size_t)a,state_00);
      eVar2 = 0x1fe;
      if (bVar1 != 0) {
        eVar2 = 0;
      }
      blobClose((blob_t)0x14b495);
      return eVar2;
    }
    local_4 = 0x12d;
  }
  else {
    local_4 = 0x1f6;
  }
  return local_4;
}

Assistant:

err_t bign96Verify(const bign_params* params, const octet oid_der[],
	size_t oid_len, const octet hash[24], const octet sig[34],
	const octet pubkey[48])
{
	err_t code;
	size_t n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */	
	word* Q;			/* [2n] открытый ключ */
	word* R;			/* [2n] точка R */
	word* H;			/* [n] хэш-значение */
	word* s0;			/* [W_OF_O(13)] первая часть подписи */
	word* s1;			/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96Verify_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(hash, 24) ||
		!memIsValid(sig, 34) ||
		!memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = R = objEnd(ec, word);
	H = s0 = Q + 2 * n;
	s1 = H + n;
	stack = (octet*)(s1 + n);
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + 24, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// загрузить и проверить s1
	wwFrom(s1, sig + 10, 24);
	if (wwCmp(s1, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	// s1 <- (s1 + H) mod q
	wwFrom(H, hash, 24);
	if (wwCmp(H, ec->order, n) >= 0)
	{
		zzSub2(H, ec->order, n);
		// 2^{l - 1} < q < 2^l, H < 2^l => H - q < q
		ASSERT(wwCmp(H, ec->order, n) < 0);
	}
	zzAddMod(s1, s1, H, ec->order, n);
	// загрузить s0
	memCopy(s0, sig, 10);
	((octet*)s0)[10] = ((octet*)s0)[11] = 0, ((octet*)s0)[12] = 0x80;
	wwFrom(s0, s0, 13);
	// R <- s1 G + (s0 + 2^l) Q
	if (!ecAddMulA(R, ec, stack, 2, ec->base, s1, n, Q, s0, (size_t)W_OF_O(13)))
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 == belt-hash(oid || R || H) mod 2^80?
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(R, 24, stack);
	beltHashStepH(hash, 24, stack);
	code = beltHashStepV2(sig, 10, stack) ? ERR_OK : ERR_BAD_SIG;
	// завершение
	blobClose(state);
	return code;
}